

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(cmGlobalNinjaGenerator *this,cmake *cm)

{
  _Rb_tree_header *p_Var1;
  
  cmGlobalCommonGenerator::cmGlobalCommonGenerator(&this->super_cmGlobalCommonGenerator,cm);
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalNinjaGenerator_00a11788;
  p_Var1 = &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header;
  (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header;
  (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->DefaultFileConfig)._M_dataplus._M_p = (pointer)&(this->DefaultFileConfig).field_2;
  (this->DefaultFileConfig)._M_string_length = 0;
  (this->DefaultFileConfig).field_2._M_local_buf[0] = '\0';
  (this->CompileCommandsStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  (this->BuildFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  (this->RulesFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  (this->Rules)._M_h._M_buckets = &(this->Rules)._M_h._M_single_bucket;
  (this->Rules)._M_h._M_bucket_count = 1;
  (this->Rules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Rules)._M_h._M_element_count = 0;
  (this->Rules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Rules)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Rules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->RuleCmdLength)._M_h._M_buckets = &(this->RuleCmdLength)._M_h._M_single_bucket;
  (this->RuleCmdLength)._M_h._M_bucket_count = 1;
  (this->RuleCmdLength)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->RuleCmdLength)._M_h._M_element_count = 0;
  (this->RuleCmdLength)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
  this->UsingGCCOnWindows = false;
  (this->RuleCmdLength)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->RuleCmdLength)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ComputingUnknownDependencies = false;
  this->PolicyCMP0058 = WARN;
  p_Var1 = &(this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PerConfigUtilityTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->PerConfigUtilityTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PerConfigUtilityTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PerConfigUtilityTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PerConfigUtilityTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PerConfigUtilityTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->TargetAliases)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header;
  (this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ConvertToNinjaPathCache)._M_h._M_buckets =
       &(this->ConvertToNinjaPathCache)._M_h._M_single_bucket;
  (this->ConvertToNinjaPathCache)._M_h._M_bucket_count = 1;
  (this->ConvertToNinjaPathCache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ConvertToNinjaPathCache)._M_h._M_element_count = 0;
  (this->ConvertToNinjaPathCache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ConvertToNinjaPathCache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ConvertToNinjaPathCache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->NinjaCommand)._M_dataplus._M_p = (pointer)&(this->NinjaCommand).field_2;
  (this->NinjaCommand)._M_string_length = 0;
  (this->NinjaCommand).field_2._M_local_buf[0] = '\0';
  (this->NinjaVersion)._M_dataplus._M_p = (pointer)&(this->NinjaVersion).field_2;
  (this->NinjaVersion)._M_string_length = 0;
  (this->NinjaVersion).field_2._M_local_buf[0] = '\0';
  this->DiagnosedCxxModuleNinjaSupport = false;
  this->NinjaSupportsConsolePool = false;
  this->NinjaSupportsImplicitOuts = false;
  this->NinjaSupportsManifestRestat = false;
  this->NinjaSupportsMultilineDepfile = false;
  this->NinjaSupportsDyndepsCxx = false;
  this->NinjaSupportsDyndepsFortran = false;
  this->NinjaSupportsRestatTool = false;
  this->NinjaSupportsUnconditionalRecompactTool = false;
  this->NinjaSupportsMultipleOutputs = false;
  this->NinjaSupportsMetadataOnRegeneration = false;
  this->NinjaSupportsCodePage = false;
  this->NinjaSupportsCWDDepend = false;
  this->NinjaExpectedEncoding = None;
  (this->OutputPathPrefix)._M_dataplus._M_p = (pointer)&(this->OutputPathPrefix).field_2;
  (this->OutputPathPrefix)._M_string_length = 0;
  (this->OutputPathPrefix).field_2._M_local_buf[0] = '\0';
  (this->TargetAll)._M_dataplus._M_p = (pointer)&(this->TargetAll).field_2;
  (this->TargetAll)._M_string_length = 0;
  (this->TargetAll).field_2._M_local_buf[0] = '\0';
  (this->CMakeCacheFile)._M_dataplus._M_p = (pointer)&(this->CMakeCacheFile).field_2;
  (this->CMakeCacheFile)._M_string_length = 0;
  (this->CMakeCacheFile).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Configs)._M_t._M_impl.super__Rb_tree_header;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ByproductsForCleanTarget).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ByproductsForCleanTarget).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ByproductsForCleanTarget).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmState::SetNinja((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                    _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                    super__Head_base<0UL,_cmState_*,_false>._M_head_impl,true);
  std::__cxx11::string::assign
            ((char *)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      FindMakeProgramFile);
  return;
}

Assistant:

cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(cmake* cm)
  : cmGlobalCommonGenerator(cm)
{
#ifdef _WIN32
  cm->GetState()->SetWindowsShell(true);

  // Attempt to use full path to COMSPEC, default "cmd.exe"
  std::string comspec;
  if (cmSystemTools::GetEnv("COMSPEC", comspec) &&
      cmSystemTools::FileIsFullPath(comspec)) {
    this->Comspec = comspec;
  } else {
    this->Comspec = "cmd.exe";
  }
#endif
  cm->GetState()->SetNinja(true);
  this->FindMakeProgramFile = "CMakeNinjaFindMake.cmake";
}